

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O2

void initStdConnTable(void)

{
  long lVar1;
  StdResConnTableEntry_t *elem;
  
  for (lVar1 = 0; lVar1 != 0x51c8; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)StdResTblBucket + lVar1) = 0;
  }
  for (elem = StandardResAtomConnRec; elem->key != (char *)0x0; elem = elem + 1) {
    InsertInStdResConnTable(elem);
  }
  return;
}

Assistant:

void initStdConnTable() {
   StdResConnTableEntry_t *r;
   int i;

   for (i = 0; i < M; i++) { /* empty all the buckets */
      StdResTblBucket[i] = NULL;
   }

   for( r = StandardResAtomConnRec; r->key != NULL; r++) {
      InsertInStdResConnTable(r);
   }
}